

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attached_database.cpp
# Opt level: O2

void __thiscall
duckdb::AttachedDatabase::AttachedDatabase
          (AttachedDatabase *this,DatabaseInstance *db,AttachedDatabaseType type)

{
  _Head_base<0UL,_duckdb::StorageManager_*,_false> _Var1;
  _Head_base<0UL,_duckdb::Catalog_*,_false> _Var2;
  _Head_base<0UL,_duckdb::TransactionManager_*,_false> _Var3;
  _Head_base<0UL,_duckdb::StorageManager_*,_false> _Var4;
  _Alloc_hider _Var5;
  char *pcVar6;
  bool local_7a;
  allocator local_79;
  _Head_base<0UL,_duckdb::StorageManager_*,_false> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  pcVar6 = "temp";
  if (type == SYSTEM_DATABASE) {
    pcVar6 = "system";
  }
  ::std::__cxx11::string::string((string *)&local_50,pcVar6,(allocator *)&local_70);
  CatalogEntry::CatalogEntry(&this->super_CatalogEntry,DATABASE_ENTRY,&local_50,0);
  ::std::__cxx11::string::~string((string *)&local_50);
  (this->super_CatalogEntry)._vptr_CatalogEntry = (_func_int **)&PTR__AttachedDatabase_027bb1c8;
  this->db = db;
  (this->storage).
  super_unique_ptr<duckdb::StorageManager,_std::default_delete<duckdb::StorageManager>_>._M_t.
  super___uniq_ptr_impl<duckdb::StorageManager,_std::default_delete<duckdb::StorageManager>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::StorageManager_*,_std::default_delete<duckdb::StorageManager>_>.
  super__Head_base<0UL,_duckdb::StorageManager_*,_false>._M_head_impl = (StorageManager *)0x0;
  (this->catalog).super_unique_ptr<duckdb::Catalog,_std::default_delete<duckdb::Catalog>_>._M_t.
  super___uniq_ptr_impl<duckdb::Catalog,_std::default_delete<duckdb::Catalog>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Catalog_*,_std::default_delete<duckdb::Catalog>_>.
  super__Head_base<0UL,_duckdb::Catalog_*,_false>._M_head_impl = (Catalog *)0x0;
  (this->transaction_manager).
  super_unique_ptr<duckdb::TransactionManager,_std::default_delete<duckdb::TransactionManager>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::TransactionManager,_std::default_delete<duckdb::TransactionManager>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::TransactionManager_*,_std::default_delete<duckdb::TransactionManager>_>
  .super__Head_base<0UL,_duckdb::TransactionManager_*,_false>._M_head_impl =
       (TransactionManager *)0x0;
  this->type = type;
  this->is_initial_database = false;
  this->is_closed = false;
  (this->parent_catalog).ptr = (Catalog *)0x0;
  (this->storage_extension).ptr = (StorageExtension *)0x0;
  if (type == TEMP_DATABASE) {
    ::std::__cxx11::string::string((string *)&local_70,":memory:",&local_79);
    local_7a = false;
    make_uniq<duckdb::SingleFileStorageManager,duckdb::AttachedDatabase&,std::__cxx11::string,bool>
              ((duckdb *)&local_78,this,&local_70,&local_7a);
    _Var4._M_head_impl = local_78._M_head_impl;
    local_78._M_head_impl = (StorageManager *)0x0;
    _Var1._M_head_impl =
         (this->storage).
         super_unique_ptr<duckdb::StorageManager,_std::default_delete<duckdb::StorageManager>_>._M_t
         .
         super___uniq_ptr_impl<duckdb::StorageManager,_std::default_delete<duckdb::StorageManager>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::StorageManager_*,_std::default_delete<duckdb::StorageManager>_>
         .super__Head_base<0UL,_duckdb::StorageManager_*,_false>._M_head_impl;
    (this->storage).
    super_unique_ptr<duckdb::StorageManager,_std::default_delete<duckdb::StorageManager>_>._M_t.
    super___uniq_ptr_impl<duckdb::StorageManager,_std::default_delete<duckdb::StorageManager>_>._M_t
    .super__Tuple_impl<0UL,_duckdb::StorageManager_*,_std::default_delete<duckdb::StorageManager>_>.
    super__Head_base<0UL,_duckdb::StorageManager_*,_false>._M_head_impl = _Var4._M_head_impl;
    if (_Var1._M_head_impl != (StorageManager *)0x0) {
      (**(code **)((long)(_Var1._M_head_impl)->_vptr_StorageManager + 8))();
      if (local_78._M_head_impl != (StorageManager *)0x0) {
        (**(code **)(*(long *)local_78._M_head_impl + 8))();
      }
    }
    local_78._M_head_impl = (StorageManager *)0x0;
    ::std::__cxx11::string::~string((string *)&local_70);
  }
  make_uniq<duckdb::DuckCatalog,duckdb::AttachedDatabase&>((duckdb *)&local_70,this);
  _Var5._M_p = local_70._M_dataplus._M_p;
  local_70._M_dataplus._M_p = (pointer)0x0;
  _Var2._M_head_impl =
       (this->catalog).super_unique_ptr<duckdb::Catalog,_std::default_delete<duckdb::Catalog>_>._M_t
       .super___uniq_ptr_impl<duckdb::Catalog,_std::default_delete<duckdb::Catalog>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Catalog_*,_std::default_delete<duckdb::Catalog>_>.
       super__Head_base<0UL,_duckdb::Catalog_*,_false>._M_head_impl;
  (this->catalog).super_unique_ptr<duckdb::Catalog,_std::default_delete<duckdb::Catalog>_>._M_t.
  super___uniq_ptr_impl<duckdb::Catalog,_std::default_delete<duckdb::Catalog>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Catalog_*,_std::default_delete<duckdb::Catalog>_>.
  super__Head_base<0UL,_duckdb::Catalog_*,_false>._M_head_impl = (Catalog *)_Var5._M_p;
  if (_Var2._M_head_impl != (Catalog *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_Catalog + 8))();
    if ((TransactionManager *)local_70._M_dataplus._M_p != (TransactionManager *)0x0) {
      (**(code **)(*(long *)local_70._M_dataplus._M_p + 8))();
    }
  }
  make_uniq<duckdb::DuckTransactionManager,duckdb::AttachedDatabase&>((duckdb *)&local_70,this);
  _Var5._M_p = local_70._M_dataplus._M_p;
  local_70._M_dataplus._M_p = (pointer)0x0;
  _Var3._M_head_impl =
       (this->transaction_manager).
       super_unique_ptr<duckdb::TransactionManager,_std::default_delete<duckdb::TransactionManager>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::TransactionManager,_std::default_delete<duckdb::TransactionManager>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::TransactionManager_*,_std::default_delete<duckdb::TransactionManager>_>
       .super__Head_base<0UL,_duckdb::TransactionManager_*,_false>._M_head_impl;
  (this->transaction_manager).
  super_unique_ptr<duckdb::TransactionManager,_std::default_delete<duckdb::TransactionManager>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::TransactionManager,_std::default_delete<duckdb::TransactionManager>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::TransactionManager_*,_std::default_delete<duckdb::TransactionManager>_>
  .super__Head_base<0UL,_duckdb::TransactionManager_*,_false>._M_head_impl =
       (TransactionManager *)_Var5._M_p;
  if (_Var3._M_head_impl != (TransactionManager *)0x0) {
    (**(code **)((long)(_Var3._M_head_impl)->_vptr_TransactionManager + 8))();
    if ((long *)local_70._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_70._M_dataplus._M_p + 8))();
    }
  }
  (this->super_CatalogEntry).internal = true;
  return;
}

Assistant:

AttachedDatabase::AttachedDatabase(DatabaseInstance &db, AttachedDatabaseType type)
    : CatalogEntry(CatalogType::DATABASE_ENTRY,
                   type == AttachedDatabaseType::SYSTEM_DATABASE ? SYSTEM_CATALOG : TEMP_CATALOG, 0),
      db(db), type(type) {

	// This database does not have storage, or uses temporary_objects for in-memory storage.
	D_ASSERT(type == AttachedDatabaseType::TEMP_DATABASE || type == AttachedDatabaseType::SYSTEM_DATABASE);
	if (type == AttachedDatabaseType::TEMP_DATABASE) {
		storage = make_uniq<SingleFileStorageManager>(*this, string(IN_MEMORY_PATH), false);
	}

	catalog = make_uniq<DuckCatalog>(*this);
	transaction_manager = make_uniq<DuckTransactionManager>(*this);
	internal = true;
}